

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::MaybeTripleQuotedString(AsciiParser *this,StringData *str)

{
  bool bVar1;
  uint64_t pos;
  size_type sVar2;
  reference pvVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  ulong uVar6;
  long lVar7;
  string local_3d8;
  undefined1 local_3b8 [8];
  string s;
  undefined1 local_390 [5];
  char d;
  vector<char,_std::allocator<char>_> buf;
  int local_370;
  char c;
  int iStack_36c;
  bool got_closing_triple_quote;
  int double_quote_count;
  int single_quote_count;
  Cursor locinfo;
  stringstream str_buf;
  ostream aoStack_350 [379];
  byte local_1d5;
  int local_1d4;
  undefined1 local_1d0 [3];
  bool single_quote;
  vector<char,_std::allocator<char>_> triple_quote;
  Cursor start_cursor;
  uint64_t loc;
  stringstream ss;
  StringData *str_local;
  AsciiParser *this_local;
  
  ::std::__cxx11::stringstream::stringstream((stringstream *)&loc);
  pos = CurrLoc(this);
  triple_quote.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = this->_curr_cursor;
  ::std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_1d0);
  bVar1 = CharN(this,3,(vector<char,_std::allocator<char>_> *)local_1d0);
  if (bVar1) {
    sVar2 = ::std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)local_1d0);
    if (sVar2 == 3) {
      local_1d5 = 0;
      pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)local_1d0,0);
      if (((*pvVar3 != '\"') ||
          (pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                              ((vector<char,_std::allocator<char>_> *)local_1d0,1), *pvVar3 != '\"')
          ) || (pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                                   ((vector<char,_std::allocator<char>_> *)local_1d0,2),
               *pvVar3 != '\"')) {
        pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)local_1d0,0);
        if (((*pvVar3 != '\'') ||
            (pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                                ((vector<char,_std::allocator<char>_> *)local_1d0,1),
            *pvVar3 != '\'')) ||
           (pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                               ((vector<char,_std::allocator<char>_> *)local_1d0,2), *pvVar3 != '\''
           )) {
          SeekTo(this,pos);
          this_local._7_1_ = 0;
          local_1d4 = 1;
          goto LAB_0058d98d;
        }
        local_1d5 = 1;
      }
      ::std::__cxx11::stringstream::stringstream((stringstream *)&locinfo);
      _double_quote_count = this->_curr_cursor;
      iStack_36c = 0;
      local_370 = 0;
      buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ = 0;
LAB_0058d43f:
      do {
        bVar1 = Eof(this);
        if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_0058d87a;
        bVar1 = Char1(this,&buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x16);
        if (!bVar1) {
          SeekTo(this,pos);
          this_local._7_1_ = 0;
          local_1d4 = 1;
          goto LAB_0058d981;
        }
        if (buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._22_1_ == '\\') {
          s.field_2._M_local_buf[0xf] = '\0';
          ::std::allocator<char>::allocator();
          ::std::vector<char,_std::allocator<char>_>::vector
                    ((vector<char,_std::allocator<char>_> *)local_390,3,s.field_2._M_local_buf + 0xf
                     ,(allocator_type *)(s.field_2._M_local_buf + 0xe));
          ::std::allocator<char>::~allocator((allocator<char> *)(s.field_2._M_local_buf + 0xe));
          bVar1 = LookCharN(this,3,(vector<char,_std::allocator<char>_> *)local_390);
          if (bVar1) {
            pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                               ((vector<char,_std::allocator<char>_> *)local_390,0);
            if (((*pvVar3 == '\'') &&
                (pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                                    ((vector<char,_std::allocator<char>_> *)local_390,1),
                *pvVar3 == '\'')) &&
               (pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                                   ((vector<char,_std::allocator<char>_> *)local_390,2),
               *pvVar3 == '\'')) {
              ::std::operator<<(aoStack_350,"\'\'\'");
              StreamReader::seek_from_current(this->_sr,3);
              single_quote_count = single_quote_count + 3;
              local_1d4 = 2;
            }
            else {
              pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                                 ((vector<char,_std::allocator<char>_> *)local_390,0);
              if (((*pvVar3 == '\"') &&
                  (pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                                      ((vector<char,_std::allocator<char>_> *)local_390,1),
                  *pvVar3 == '\"')) &&
                 (pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                                     ((vector<char,_std::allocator<char>_> *)local_390,2),
                 *pvVar3 == '\"')) {
                ::std::operator<<(aoStack_350,"\"\"\"");
                StreamReader::seek_from_current(this->_sr,3);
                single_quote_count = single_quote_count + 3;
                local_1d4 = 2;
              }
              else {
                local_1d4 = 0;
              }
            }
          }
          else {
            this_local._7_1_ = 0;
            local_1d4 = 1;
          }
          std::vector<char,_std::allocator<char>_>::~vector
                    ((vector<char,_std::allocator<char>_> *)local_390);
          if (local_1d4 != 0) {
            if (local_1d4 != 2) goto LAB_0058d981;
            goto LAB_0058d43f;
          }
        }
        ::std::operator<<(aoStack_350,
                          buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._22_1_);
        if (buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._22_1_ == '\"') {
          local_370 = local_370 + 1;
          iStack_36c = 0;
        }
        else {
          if (buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._22_1_ == '\'') {
            iStack_36c = iStack_36c + 1;
          }
          else {
            iStack_36c = 0;
          }
          local_370 = 0;
        }
        single_quote_count = single_quote_count + 1;
        if (buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._22_1_ == '\n') {
          single_quote_count = 0;
          double_quote_count = double_quote_count + 1;
        }
        else if (buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._22_1_ == '\r') {
          uVar4 = StreamReader::tell(this->_sr);
          uVar5 = StreamReader::size(this->_sr);
          if (uVar4 < uVar5 - 1) {
            bVar1 = Char1(this,s.field_2._M_local_buf + 0xd);
            if (!bVar1) {
              SeekTo(this,pos);
              this_local._7_1_ = 0;
              local_1d4 = 1;
              goto LAB_0058d981;
            }
            if (s.field_2._M_local_buf[0xd] == '\n') {
              ::std::operator<<(aoStack_350,'\n');
            }
            else {
              bVar1 = StreamReader::seek_from_current(this->_sr,-1);
              if (!bVar1) {
                SeekTo(this,pos);
                this_local._7_1_ = 0;
                local_1d4 = 1;
                goto LAB_0058d981;
              }
            }
          }
          single_quote_count = 0;
          double_quote_count = double_quote_count + 1;
        }
        if ((local_370 == 3) && ((local_1d5 & 1) == 0)) {
          buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ = 1;
          goto LAB_0058d87a;
        }
      } while ((iStack_36c != 3) || (local_370 != 0));
      buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ = 1;
LAB_0058d87a:
      if ((buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ & 1) == 0) {
        SeekTo(this,pos);
        this_local._7_1_ = 0;
        local_1d4 = 1;
      }
      else {
        str->single_quote = (bool)(local_1d5 & 1);
        ::std::__cxx11::stringstream::str();
        uVar6 = ::std::__cxx11::string::size();
        if (3 < uVar6) {
          lVar7 = ::std::__cxx11::string::size();
          ::std::__cxx11::string::erase((ulong)local_3b8,lVar7 - 3);
        }
        unescapeControlSequence(&local_3d8,(string *)local_3b8);
        ::std::__cxx11::string::operator=((string *)str,(string *)&local_3d8);
        ::std::__cxx11::string::~string((string *)&local_3d8);
        str->line_col = triple_quote.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_;
        str->line_row = triple_quote.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_;
        str->is_triple_quoted = true;
        this->_curr_cursor = _double_quote_count;
        this_local._7_1_ = 1;
        local_1d4 = 1;
        ::std::__cxx11::string::~string((string *)local_3b8);
      }
LAB_0058d981:
      ::std::__cxx11::stringstream::~stringstream((stringstream *)&locinfo);
    }
    else {
      SeekTo(this,pos);
      this_local._7_1_ = 0;
      local_1d4 = 1;
    }
  }
  else {
    SeekTo(this,pos);
    this_local._7_1_ = 0;
    local_1d4 = 1;
  }
LAB_0058d98d:
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)local_1d0);
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&loc);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool AsciiParser::MaybeTripleQuotedString(value::StringData *str) {
  std::stringstream ss;

  auto loc = CurrLoc();
  auto start_cursor = _curr_cursor;

  std::vector<char> triple_quote;
  if (!CharN(3, &triple_quote)) {
    SeekTo(loc);
    return false;
  }

  if (triple_quote.size() != 3) {
    SeekTo(loc);
    return false;
  }

  bool single_quote = false;

  if (triple_quote[0] == '"' && triple_quote[1] == '"' &&
      triple_quote[2] == '"') {
    // ok
  } else if (triple_quote[0] == '\'' && triple_quote[1] == '\'' &&
             triple_quote[2] == '\'') {
    // ok
    single_quote = true;
  } else {
    SeekTo(loc);
    return false;
  }

  // Read until next triple-quote `"""` or "'''"
  std::stringstream str_buf;

  auto locinfo = _curr_cursor;

  int single_quote_count = 0;  // '
  int double_quote_count = 0;  // "

  bool got_closing_triple_quote{false};

  while (!Eof()) {
    char c;

    if (!Char1(&c)) {
      SeekTo(loc);
      return false;
    }

    // Seek \""" or \'''
    // Unescape '\'
    if (c == '\\') {
      std::vector<char> buf(3, '\0');
      if (!LookCharN(3, &buf)) {
        // at least 3 chars should be read
        return false;
      }

      if (buf[0] == '\'' && buf[1] == '\'' && buf[2] == '\'') {
        str_buf << "'''";
        // advance
        _sr->seek_from_current(3);
        locinfo.col += 3;
        continue;
      } else if (buf[0] == '"' && buf[1] == '"' && buf[2] == '"') {
        str_buf << "\"\"\"";
        // advance
        _sr->seek_from_current(3);
        locinfo.col += 3;
        continue;
      }
    }

    str_buf << c;

    if (c == '"') {
      double_quote_count++;
      single_quote_count = 0;
    } else if (c == '\'') {
      double_quote_count = 0;
      single_quote_count++;
    } else {
      double_quote_count = 0;
      single_quote_count = 0;
    }

    // Update loc info
    locinfo.col++;
    if (c == '\n') {
      locinfo.col = 0;
      locinfo.row++;
    } else if (c == '\r') {
      // CRLF?
      if (_sr->tell() < (_sr->size() - 1)) {
        char d;
        if (!Char1(&d)) {
          // this should not happen.
          SeekTo(loc);
          return false;
        }

        if (d == '\n') {
          // CRLF
          str_buf << d;
        } else {
          // unwind 1 char
          if (!_sr->seek_from_current(-1)) {
            // this should not happen.
            SeekTo(loc);
            return false;
          }
        }
      }
      locinfo.col = 0;
      locinfo.row++;
    }

    if (double_quote_count == 3) {
      // got '"""'
      if (single_quote) {
        // continue
      } else {
        got_closing_triple_quote = true;
        break;
      }
    }
    if (single_quote_count == 3) {
      // got '''
      if (double_quote_count) {
        // continue
      } else {
        got_closing_triple_quote = true;
        break;
      }
    }
  }

  if (!got_closing_triple_quote) {
    SeekTo(loc);
    return false;
  }

  DCOUT("single_quote = " << single_quote);
  DCOUT("Triple quoted string found. col " << start_cursor.col << ", row "
                                           << start_cursor.row);

  // remove last '"""' or '''
  str->single_quote = single_quote;
  std::string s = str_buf.str();
  if (s.size() > 3) {  // just in case
    s.erase(s.size() - 3);
  }

  DCOUT("str = " << s);

  str->value = unescapeControlSequence(s);

  DCOUT("unescape str = " << str->value);

  str->line_col = start_cursor.col;
  str->line_row = start_cursor.row;
  str->is_triple_quoted = true;

  _curr_cursor = locinfo;

  return true;
}